

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O2

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherStride
               ,level3_blocking<double,_double> *blocking)

{
  long lVar1;
  size_t size_00;
  double dVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double *pdVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  long depth;
  long lVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  long j;
  long lVar21;
  long i3;
  long lVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  ulong uVar27;
  double dStack_1c8;
  ptrdiff_t local_1c0;
  ptrdiff_t l1;
  aligned_stack_memory_handler<double> blockA_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockB_stack_memory_destructor;
  aligned_stack_memory_handler<double> blockW_stack_memory_destructor;
  ptrdiff_t l2;
  double *local_e8;
  double *local_d8;
  long local_d0;
  double *local_c8;
  double *local_a8;
  long local_90;
  RhsScalar *local_88;
  long cols;
  double *local_70;
  double *local_58;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_4,_0,_false,_true> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_31 [7];
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp_kernel;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  
  pdVar7 = &dStack_1c8;
  lVar3 = blocking->m_kc;
  lVar25 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar25 = size;
  }
  pdVar26 = (double *)(lVar25 * lVar3);
  if ((ulong)pdVar26 >> 0x3d != 0) {
    throw_std_bad_alloc();
  }
  pdVar24 = (double *)(lVar3 * otherSize);
  local_58 = blocking->m_blockA;
  uVar27 = (long)pdVar26 * 8;
  if (local_58 == (LhsScalar *)0x0) {
    if (uVar27 < 0x20001) {
      l1 = (long)&dStack_1c8 - (uVar27 + 0xf & 0xfffffffffffffff0);
      blockA_stack_memory_destructor.m_size._0_1_ = false;
      pdVar7 = (double *)l1;
      local_58 = (double *)l1;
    }
    else {
      local_58 = (double *)aligned_malloc(uVar27);
      l1 = (ptrdiff_t)(double *)0x0;
      if (blocking->m_blockA == (LhsScalar *)0x0) {
        l1 = (ptrdiff_t)local_58;
      }
      blockA_stack_memory_destructor.m_size._0_1_ = true;
    }
  }
  else {
    blockA_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar27;
    l1 = 0;
    pdVar7 = &dStack_1c8;
  }
  blockA_stack_memory_destructor.m_ptr = pdVar26;
  if ((double *)0x1fffffffffffffff < pdVar24) {
    pdVar7[-1] = 5.67821247649365e-318;
    throw_std_bad_alloc();
  }
  size_00 = (long)pdVar24 * 8;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (size_00 < 0x20001) {
      pdVar7 = (double *)((long)pdVar7 - (size_00 + 0xf & 0xfffffffffffffff0));
      blockA_stack_memory_destructor._16_8_ = pdVar7;
      cols = (long)pdVar7;
    }
    else {
      pdVar7[-1] = 5.67853855981991e-318;
      cols = (long)aligned_malloc(size_00);
      blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
      if (blocking->m_blockB == (RhsScalar *)0x0) {
        blockA_stack_memory_destructor._16_8_ = cols;
      }
    }
  }
  else {
    blockA_stack_memory_destructor._16_8_ = (undefined1 *)0x0;
    cols = (long)blocking->m_blockB;
  }
  blockB_stack_memory_destructor.m_size._0_1_ = 0x20000 < size_00;
  blockB_stack_memory_destructor.m_ptr = pdVar24;
  if ((double *)0x1fffffffffffffff < (double *)(lVar3 * 8)) {
    *(undefined8 *)((long)pdVar7 + -8) = 0x1189f8;
    throw_std_bad_alloc();
  }
  uVar27 = lVar3 * 0x40;
  if (blocking->m_blockW == (RhsScalar *)0x0) {
    if (uVar27 < 0x20001) {
      pdVar7 = (double *)((long)pdVar7 + lVar3 * -0x40);
      blockB_stack_memory_destructor._16_8_ = pdVar7;
      local_88 = pdVar7;
    }
    else {
      *(undefined8 *)((long)pdVar7 + -8) = 0x118a3a;
      local_88 = (RhsScalar *)aligned_malloc(uVar27);
      blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
      if (blocking->m_blockW == (RhsScalar *)0x0) {
        blockB_stack_memory_destructor._16_8_ = local_88;
      }
    }
  }
  else {
    blockB_stack_memory_destructor._16_8_ = (RhsScalar *)0x0;
    local_88 = blocking->m_blockW;
  }
  blockW_stack_memory_destructor.m_size._0_1_ = 0x20000 < uVar27;
  blockW_stack_memory_destructor.m_ptr = (double *)(lVar3 * 8);
  pdVar7[-1] = 5.67963044489722e-318;
  manage_caching_sizes
            (GetAction,&local_1c0,(ptrdiff_t *)&blockW_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 1.97626258336499e-323;
  if (otherSize < 1) {
    lVar18 = 0;
  }
  else {
    lVar18 = (long)((ulong)blockW_stack_memory_destructor._16_8_ / (ulong)(otherStride << 5)) /
             (long)pdVar7[-1] << 2;
  }
  if (lVar18 < 5) {
    lVar18 = (long)pdVar7[-1];
  }
  local_e8 = _tri + 1;
  lVar14 = lVar3 * (triStride * 8 + 8);
  pdVar26 = _other + 1;
  local_d8 = _tri + lVar3;
  local_d0 = size - lVar3;
  local_c8 = _other + lVar3;
  local_90 = 0;
  lVar13 = size;
  while( true ) {
    lVar6 = lVar13;
    if (lVar3 < lVar13) {
      lVar6 = lVar3;
    }
    depth = size - local_90;
    if (depth == 0 || size < local_90) break;
    if (lVar3 < depth) {
      depth = lVar3;
    }
    local_a8 = pdVar26;
    for (lVar10 = 0; lVar4 = otherSize - lVar10, lVar4 != 0 && lVar10 <= otherSize;
        lVar10 = lVar10 + lVar18) {
      if (lVar18 < lVar4) {
        lVar4 = lVar18;
      }
      pdVar24 = (double *)(cols + lVar10 * depth * 8);
      lVar23 = 0;
      lVar9 = lVar6;
      pdVar11 = local_a8;
      pdVar15 = local_e8;
      while( true ) {
        pdVar7[-1] = 1.97626258336499e-323;
        lVar5 = (long)pdVar7[-1];
        if (lVar9 < 4) {
          lVar5 = lVar9;
        }
        lVar19 = 0;
        if (0 < lVar5) {
          lVar19 = lVar5;
        }
        pdStack_40 = (double *)(depth - lVar23);
        if (pdStack_40 == (double *)0x0 || depth < lVar23) break;
        lVar1 = lVar23 + local_90;
        lVar16 = 0;
        pdVar8 = pdVar11;
        pdVar12 = pdVar15;
        lVar21 = (long)pdStack_40;
        while( true ) {
          lVar5 = lVar5 + -1;
          lVar17 = 0;
          if (0 < lVar5) {
            lVar17 = lVar5;
          }
          if (lVar16 == lVar19) break;
          pdVar20 = pdVar8;
          for (lVar21 = lVar10; lVar21 < lVar4 + lVar10; lVar21 = lVar21 + 1) {
            dVar2 = _other[lVar21 * otherStride + lVar1 + lVar16];
            for (lVar22 = 0; lVar17 != lVar22; lVar22 = lVar22 + 1) {
              pdVar20[lVar22] = pdVar12[lVar22] * -dVar2 + pdVar20[lVar22];
            }
            pdVar20 = pdVar20 + otherStride;
          }
          lVar16 = lVar16 + 1;
          pdVar12 = pdVar12 + triStride + 1;
          pdVar8 = pdVar8 + 1;
          lVar21 = (long)pdStack_40;
        }
        pdVar7[-1] = 1.97626258336499e-323;
        lVar5 = (long)pdVar7[-1];
        if (lVar21 < 4) {
          lVar5 = lVar21;
        }
        pdVar7[-1] = (double)lVar23;
        pdVar7[-2] = (double)depth;
        pdVar7[-3] = 5.68314325163915e-318;
        gemm_pack_rhs<double,_long,_4,_0,_false,_true>::operator()
                  (&local_41,pdVar24,_other + lVar10 * otherStride + lVar1,otherStride,lVar5,lVar4,
                   (long)pdVar7[-2],(long)pdVar7[-1]);
        lVar19 = (long)pdStack_40 - lVar5;
        if (lVar19 != 0 && lVar5 <= (long)pdStack_40) {
          pdStack_40 = (double *)(lVar5 + lVar1);
          pdVar7[-2] = 0.0;
          pdVar7[-1] = 0.0;
          pdVar7[-3] = 5.6836126140027e-318;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (local_31,local_58,_tri + lVar1 * triStride + lVar5 + lVar1,triStride,lVar5,
                     lVar19,(long)pdVar7[-2],(long)pdVar7[-1]);
          lVar1 = lVar10 * otherStride + (long)pdStack_40;
          pdVar7[-2] = (double)local_88;
          pdVar7[-3] = (double)lVar23;
          pdVar7[-4] = 0.0;
          pdVar7[-5] = (double)depth;
          pdVar7[-6] = (double)lVar5;
          pdVar7[-7] = (double)lVar4;
          pdVar7[-8] = (double)lVar5;
          pdVar7[-9] = 5.68401280717583e-318;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,_other + lVar1,otherStride,local_58,pdVar24,lVar19,(long)pdVar7[-8],
                     (long)pdVar7[-7],-1.0,(long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],
                     (long)pdVar7[-3],(double *)pdVar7[-2]);
        }
        lVar23 = lVar23 + 4;
        lVar9 = lVar9 + -4;
        pdVar15 = pdVar15 + triStride * 4 + 4;
        pdVar11 = pdVar11 + 4;
      }
      local_a8 = local_a8 + otherStride * lVar18;
    }
    local_70 = local_c8;
    pdStack_40 = local_d8;
    local_90 = local_90 + lVar3;
    lVar10 = local_d0;
    for (lVar6 = local_90; lVar6 < size; lVar6 = lVar6 + lVar25) {
      lVar4 = lVar10;
      if (lVar25 <= lVar10) {
        lVar4 = lVar25;
      }
      if (0 < lVar4) {
        pdVar7[-2] = 0.0;
        pdVar7[-1] = 0.0;
        pdVar24 = pdStack_40;
        pdVar7[-3] = 5.68514915816126e-318;
        gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                  (local_31,local_58,pdVar24,triStride,depth,lVar4,(long)pdVar7[-2],(long)pdVar7[-1]
                  );
        pdVar7[-2] = (double)local_88;
        pdVar7[-4] = 0.0;
        pdVar7[-3] = 0.0;
        pdVar7[-5] = -NAN;
        pdVar7[-7] = (double)otherSize;
        pdVar7[-6] = -NAN;
        pdVar7[-8] = (double)depth;
        pdVar7[-9] = 5.68559875789898e-318;
        gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                  (&local_32,local_70,otherStride,local_58,(double *)cols,lVar4,(long)pdVar7[-8],
                   (long)pdVar7[-7],-1.0,(long)pdVar7[-6],(long)pdVar7[-5],(long)pdVar7[-4],
                   (long)pdVar7[-3],(double *)pdVar7[-2]);
      }
      pdStack_40 = pdStack_40 + lVar25;
      local_70 = local_70 + lVar25;
      lVar10 = lVar10 - lVar25;
    }
    lVar13 = lVar13 - lVar3;
    local_e8 = (double *)((long)local_e8 + lVar14);
    pdVar26 = pdVar26 + lVar3;
    local_d8 = (double *)((long)local_d8 + lVar14);
    local_d0 = local_d0 - lVar3;
    local_c8 = local_c8 + lVar3;
  }
  pdVar7[-1] = 5.68625092455149e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockB_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 5.68631021242899e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&blockA_stack_memory_destructor.m_deallocate);
  pdVar7[-1] = 5.68636950030649e-318;
  aligned_stack_memory_handler<double>::~aligned_stack_memory_handler
            ((aligned_stack_memory_handler<double> *)&l1);
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;
    const_blas_data_mapper<Scalar, Index, TriStorageOrder> tri(_tri,triStride);
    blas_data_mapper<Scalar, Index, ColMajor> other(_other,otherStride);

    typedef gebp_traits<Scalar,Scalar> Traits;
    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;
    std::size_t sizeW = kc*Traits::WorkSpaceFactor;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockW, sizeW, blocking.blockW());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, Traits::mr, Traits::LhsProgress, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2;
    manage_caching_sizes(GetAction, &l1, &l2);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * otherStride) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index s  = IsLower ? k2+k1 : i+1;
            Index rs = actualPanelWidth - k - 1; // remaining size

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                Scalar* r = &other(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r[i3];

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Index s = IsLower ? i+1 : i-rs;
                Scalar b = (other(i,j) *= a);
                Scalar* r = &other(s,j);
                const Scalar* l = &tri(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r[i3] -= b * conj(l[i3]);
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, &other(startBlock,j2), otherStride, actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, &tri(startTarget,startBlock), triStride, actualPanelWidth, lengthTarget);

            gebp_kernel(&other(startTarget,j2), otherStride, blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset, blockW);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, &tri(i2, IsLower ? k2 : k2-kc), triStride, actual_kc, actual_mc);

            gebp_kernel(_other+i2, otherStride, blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0, blockW);
          }
        }
      }
    }
  }